

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O0

void __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::refresh(summary_impl<unsigned_int,_6UL> *this)

{
  rep rVar1;
  ulong __n;
  ulong uVar2;
  data_t *pdVar3;
  iterator pvVar4;
  __pointer_type pdVar5;
  duration<long,_std::ratio<1L,_1000L>_> *pdVar6;
  duration<long,_std::ratio<1L,_1000L>_> *in_RDI;
  __pointer_type data_1;
  int pos;
  value_type *data;
  iterator __end0;
  iterator __begin0;
  array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL> *__range7;
  unsigned_long ms;
  rep new_tp;
  uint64_t old_tp;
  undefined4 in_stack_fffffffffffffe10;
  memory_order in_stack_fffffffffffffe14;
  data_t *in_stack_fffffffffffffe18;
  data_t *in_stack_fffffffffffffe58;
  iterator local_90;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_78;
  duration<long,_std::ratio<1L,_1000000000L>_> local_70;
  rep local_68;
  data_t *local_60 [2];
  undefined4 local_4c;
  rep local_48;
  data_t **local_40;
  duration<long,_std::ratio<1L,_1000L>_> *local_38;
  bool local_29;
  rep local_28;
  memory_order local_20;
  undefined4 local_1c;
  rep local_18;
  data_t **local_10;
  duration<long,_std::ratio<1L,_1000L>_> *local_8;
  
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(in_RDI);
  if (0 < rVar1) {
    local_60[0] = (data_t *)
                  std::__atomic_base::operator_cast_to_unsigned_long
                            ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe18);
    local_78.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_70.__r = (rep)std::chrono::
                        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ::time_since_epoch(&local_78);
    local_68 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_70);
    __n = (ulong)(local_68 - (long)local_60[0]) / 1000000;
    uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(in_RDI);
    local_18 = local_68;
    if (uVar2 <= __n) {
      pdVar6 = in_RDI + 1;
      local_48 = local_68;
      local_4c = 5;
      local_40 = local_60;
      local_38 = pdVar6;
      local_20 = std::__cmpexch_failure_order(in_stack_fffffffffffffe14);
      local_1c = 5;
      local_28 = local_18;
      switch(0x253f9b) {
      default:
        if (local_20 - consume < 2) {
          LOCK();
          pdVar3 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == pdVar3;
          if (local_29) {
            pdVar6->__r = local_18;
            pdVar3 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = pdVar3;
          }
        }
        else if (local_20 == seq_cst) {
          LOCK();
          pdVar3 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == pdVar3;
          if (local_29) {
            pdVar6->__r = local_18;
            pdVar3 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = pdVar3;
          }
        }
        else {
          LOCK();
          pdVar3 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == pdVar3;
          if (local_29) {
            pdVar6->__r = local_18;
            pdVar3 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = pdVar3;
          }
        }
        break;
      case 2:
        if (local_20 - consume < 2) {
          LOCK();
          pdVar3 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == pdVar3;
          if (local_29) {
            pdVar6->__r = local_18;
            pdVar3 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = pdVar3;
          }
        }
        else if (local_20 == seq_cst) {
          LOCK();
          pdVar3 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == pdVar3;
          if (local_29) {
            pdVar6->__r = local_18;
            pdVar3 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = pdVar3;
          }
        }
        else {
          LOCK();
          pdVar3 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == pdVar3;
          if (local_29) {
            pdVar6->__r = local_18;
            pdVar3 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = pdVar3;
          }
        }
        break;
      case 3:
        if (local_20 - consume < 2) {
          LOCK();
          in_stack_fffffffffffffe58 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == in_stack_fffffffffffffe58;
          if (local_29) {
            pdVar6->__r = local_18;
            in_stack_fffffffffffffe58 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = in_stack_fffffffffffffe58;
          }
        }
        else if (local_20 == seq_cst) {
          LOCK();
          pdVar3 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == pdVar3;
          if (local_29) {
            pdVar6->__r = local_18;
            pdVar3 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = pdVar3;
          }
        }
        else {
          LOCK();
          pdVar3 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == pdVar3;
          if (local_29) {
            pdVar6->__r = local_18;
            pdVar3 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = pdVar3;
          }
        }
        break;
      case 4:
        if (local_20 - consume < 2) {
          LOCK();
          pdVar3 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == pdVar3;
          if (local_29) {
            pdVar6->__r = local_18;
            pdVar3 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = pdVar3;
          }
        }
        else if (local_20 == seq_cst) {
          LOCK();
          in_stack_fffffffffffffe18 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == in_stack_fffffffffffffe18;
          if (local_29) {
            pdVar6->__r = local_18;
            in_stack_fffffffffffffe18 = local_60[0];
          }
          UNLOCK();
          in_stack_fffffffffffffe14 = CONCAT13(local_29,(int3)in_stack_fffffffffffffe14);
          if (!local_29) {
            local_60[0] = in_stack_fffffffffffffe18;
          }
        }
        else {
          LOCK();
          pdVar3 = (data_t *)pdVar6->__r;
          local_29 = local_60[0] == pdVar3;
          if (local_29) {
            pdVar6->__r = local_18;
            pdVar3 = local_60[0];
          }
          UNLOCK();
          if (!local_29) {
            local_60[0] = pdVar3;
          }
        }
      }
      if (local_29 != false) {
        local_10 = local_60;
        local_8 = pdVar6;
        rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(in_RDI);
        if (__n < (ulong)(rVar1 << 1)) {
          std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffe18);
          std::
          array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>::
          operator[]((array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>
                      *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),__n);
          pdVar5 = std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>::load
                             ((atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>
                               *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
          if (pdVar5 != (__pointer_type)0x0) {
            data_t::refresh(in_stack_fffffffffffffe58);
          }
          std::__atomic_base<int>::operator=
                    ((__atomic_base<int> *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
        }
        else {
          local_90 = std::
                     array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>
                     ::begin((array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>
                              *)0x25458b);
          pvVar4 = std::
                   array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>
                   ::end((array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>
                          *)0x2545a0);
          for (; local_90 != pvVar4; local_90 = local_90 + 1) {
            pdVar5 = std::atomic::operator_cast_to_data_t_
                               ((atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>
                                 *)0x2545d7);
            if (pdVar5 != (__pointer_type)0x0) {
              std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>::load
                        ((atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*> *)
                         in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
              data_t::refresh(in_stack_fffffffffffffe58);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void refresh() {
    if (refresh_time_.count() <= 0) {
      return;
    }
    uint64_t old_tp = tp_;
    auto new_tp = std::chrono::steady_clock::now().time_since_epoch().count();
    auto ms = (new_tp - old_tp) / ms_count;
    if (; ms >= refresh_time_.count()) [[unlikely]] {
      if (tp_.compare_exchange_strong(old_tp, new_tp)) {
        if (ms >= 2 * refresh_time_.count()) {
          for (auto& data : data_) {
            if (data != nullptr) {
              data.load()->refresh();
            }
          }
        }
        else {
          auto pos = frontend_data_index_ ^ 1;
          if (auto data = data_[pos].load(); data != nullptr) {
            data->refresh();
          }
          frontend_data_index_ = pos;
        }
      }
    }
  }